

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O2

TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_> __thiscall
TPZDohrAssembleList<std::complex<float>_>::PopItem(TPZDohrAssembleList<std::complex<float>_> *this)

{
  int *in_RSI;
  
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_> *)this);
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x1a))->__data);
  if (*(list<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>_>_>
        **)(in_RSI + 0x2e) !=
      (list<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>_>_>
       *)(in_RSI + 0x2e)) {
    *in_RSI = *in_RSI + -1;
    TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>::operator=
              ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_> *)this,
               (TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_> *)
               &((*(list<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>_>_>
                    **)(in_RSI + 0x2e))->
                super__List_base<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>_>_>
                )._M_impl._M_node._M_size);
    std::__cxx11::
    list<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>_>_>
    ::pop_front((list<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>_>_>
                 *)(in_RSI + 0x2e));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x1a));
  return (TPZAutoPointer<TPZDohrAssembleItem<std::complex<float>_>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZDohrAssembleItem<TVar> > TPZDohrAssembleList<TVar>::PopItem()
{
	TPZAutoPointer<TPZDohrAssembleItem<TVar> > result;
    std::lock_guard<std::mutex> lock(fListAccessLock);
	if (fWork.begin() != fWork.end()) {
		fNumItems--;
		result = *fWork.begin();
		fWork.pop_front();
	}
	return result;
}